

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpSendActionAsync(UpnpClient_Handle Hnd,char *ActionURL_const,char *ServiceType_const,
                       char *DevUDN_const,IXML_Document *Act,Upnp_FunPtr Fun,void *Cookie_const)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  char *buf;
  job_arg *arg;
  Handle_Info **HndInfo;
  int iVar3;
  ThreadPoolJob job;
  Handle_Info *local_70;
  ThreadPoolJob local_68;
  
  local_70 = (Handle_Info *)0x0;
  local_68.func = (start_routine)0x0;
  local_68.arg = (void *)0x0;
  local_68.free_func = (free_routine)0x0;
  local_68.requestTime.tv_sec = 0;
  local_68.requestTime.tv_usec = 0;
  local_68.priority = LOW_PRIORITY;
  local_68.jobId = 0;
  iVar3 = -0x74;
  if (UpnpSdkInit == 1) {
    iVar3 = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xbc5,"Inside UpnpSendActionAsync\n");
    HandleReadLock((char *)0xbc8,iVar3);
    HndInfo = &local_70;
    UVar1 = GetHandleInfo(Hnd,HndInfo);
    if (UVar1 == HND_CLIENT) {
      HandleUnlock((char *)0xbd0,(int)HndInfo);
      iVar3 = -0x65;
      if ((((ActionURL_const != (char *)0x0) && (DevUDN_const == (char *)0x0)) &&
          (ServiceType_const != (char *)0x0)) &&
         ((Act != (IXML_Document *)0x0 && (Fun != (Upnp_FunPtr)0x0)))) {
        buf = ixmlPrintNode(&Act->n);
        if (buf == (char *)0x0) {
          iVar3 = -0x73;
        }
        else {
          arg = (job_arg *)malloc(0x760);
          if (arg == (job_arg *)0x0) {
            ixmlFreeDOMString(buf);
            iVar3 = -0x68;
          }
          else {
            memset(arg,0,0x760);
            (arg->advertise).handle = 4;
            (arg->advertise).eventId = Hnd;
            strncpy((arg->action).Url,ActionURL_const,0xff);
            strncpy((arg->action).ServiceType,ServiceType_const,0xff);
            iVar2 = ixmlParseBufferEx(buf,&(arg->action).Act);
            if (iVar2 == 0) {
              ixmlFreeDOMString(buf);
              (arg->action).Cookie = (char *)Cookie_const;
              (arg->action).Fun = Fun;
              TPJobInit(&local_68,UpnpThreadDistribution,arg);
              TPJobSetFreeFunction(&local_68,free_action_arg);
              TPJobSetPriority(&local_68,MED_PRIORITY);
              iVar3 = 0;
              iVar2 = ThreadPoolAdd(&gSendThreadPool,&local_68,(int *)0x0);
              if (iVar2 != 0) {
                free_action_arg(arg);
              }
              UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xc07,
                         "Exiting UpnpSendActionAsync \n");
            }
            else {
              free(arg);
              ixmlFreeDOMString(buf);
              iVar3 = -0x73;
              if (iVar2 == 0x66) {
                iVar3 = -0x68;
              }
            }
          }
        }
      }
    }
    else {
      HandleUnlock((char *)0xbcd,(int)HndInfo);
      iVar3 = -100;
    }
  }
  return iVar3;
}

Assistant:

int UpnpSendActionAsync(UpnpClient_Handle Hnd,
	const char *ActionURL_const,
	const char *ServiceType_const,
	const char *DevUDN_const,
	IXML_Document *Act,
	Upnp_FunPtr Fun,
	const void *Cookie_const)
{
	int rc;
	ThreadPoolJob job;
	struct Handle_Info *SInfo = NULL;
	struct UpnpNonblockParam *Param;
	DOMString tmpStr;
	char *ActionURL = (char *)ActionURL_const;
	char *ServiceType = (char *)ServiceType_const;
	/* udn not used? */
	/*char *DevUDN = (char *)DevUDN_const;*/

	memset(&job, 0, sizeof(job));

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSendActionAsync\n");

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	HandleUnlock(__FILE__, __LINE__);

	if (ActionURL == NULL) {
		return UPNP_E_INVALID_PARAM;
	}
	if (ServiceType == NULL || Act == NULL || Fun == NULL ||
		DevUDN_const != NULL) {
		return UPNP_E_INVALID_PARAM;
	}
	tmpStr = ixmlPrintNode((IXML_Node *)Act);
	if (tmpStr == NULL) {
		return UPNP_E_INVALID_ACTION;
	}

	Param = (struct UpnpNonblockParam *)malloc(
		sizeof(struct UpnpNonblockParam));

	if (Param == NULL) {
		ixmlFreeDOMString(tmpStr);
		return UPNP_E_OUTOF_MEMORY;
	}
	memset(Param, 0, sizeof(struct UpnpNonblockParam));

	Param->FunName = ACTION;
	Param->Handle = Hnd;
	strncpy(Param->Url, ActionURL, sizeof(Param->Url) - 1);
	strncpy(Param->ServiceType,
		ServiceType,
		sizeof(Param->ServiceType) - 1);

	rc = ixmlParseBufferEx(tmpStr, &(Param->Act));
	if (rc != IXML_SUCCESS) {
		free(Param);
		ixmlFreeDOMString(tmpStr);
		if (rc == IXML_INSUFFICIENT_MEMORY) {
			return UPNP_E_OUTOF_MEMORY;
		} else {
			return UPNP_E_INVALID_ACTION;
		}
	}
	ixmlFreeDOMString(tmpStr);
	Param->Cookie = (void *)Cookie_const;
	Param->Fun = Fun;

	TPJobInit(&job, (start_routine)UpnpThreadDistribution, Param);
	TPJobSetFreeFunction(&job, (free_routine)free_action_arg);

	TPJobSetPriority(&job, MED_PRIORITY);
	if (ThreadPoolAdd(&gSendThreadPool, &job, NULL) != 0) {
		free_action_arg((job_arg *)Param);
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSendActionAsync \n");

	return UPNP_E_SUCCESS;
}